

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walk-ports.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  char *numeric_exp;
  int in_stack_0000044c;
  char *in_stack_00000450;
  char *in_stack_00000458;
  Ports *in_stack_00000460;
  
  check_all_subports(in_stack_00000460,in_stack_00000458,in_stack_00000450,in_stack_0000044c);
  check_all_subports(in_stack_00000460,in_stack_00000458,in_stack_00000450,in_stack_0000044c);
  check_all_subports(in_stack_00000460,in_stack_00000458,in_stack_00000450,in_stack_0000044c);
  check_all_subports(in_stack_00000460,in_stack_00000458,in_stack_00000450,in_stack_0000044c);
  iVar1 = test_summary();
  return iVar1;
}

Assistant:

int main()
{
    check_all_subports(ports, "/a/b/c/d/e;/a/b/c/d/e;",
                       "walk_ports with \"/a/b/c\"", __LINE__);

    const char* numeric_exp = "/a0/b0/c/e;/a0/b1/c/e;"
                              "/a1/b0/c/e;/a1/b1/c/e;"
                              "/a2/b0/c/e;/a2/b1/c/e;";
    check_all_subports(numeric_ports, numeric_exp,
                       "walk_ports with \"a#3/b#2/c\"", __LINE__);

    check_all_subports(numeric_ports_integer, numeric_exp,
                       "walk_ports with \"a#3/b#2/c/::i\"", __LINE__);

#if 0
    check_all_subports(numeric_port, numeric_exp,
                       "walk_ports with \"a#3/b#2/c::i\"", __LINE__);
    // still failing: bundle-foreach.h needs a recursion like walk_ports
    // has it for subports with multiple hashes
#endif

    // maybe this should once be sorted...
    check_all_subports(multiple_ports, "/c/d/e;/a/x;/a/y;/c/d/;/a/;/b;/b2;",
                       "walk_ports with multiple common prefixes", __LINE__);

    return test_summary();
}